

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_variableNotEqualById_Test::Equality_variableNotEqualById_Test
          (Equality_variableNotEqualById_Test *this)

{
  Equality_variableNotEqualById_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Equality_variableNotEqualById_Test_00149538;
  return;
}

Assistant:

TEST(Equality, variableNotEqualById)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create("variable");
    libcellml::VariablePtr v2 = libcellml::Variable::create("variable");

    v1->setId("eijei3009");
    v2->setId("lefisjeij");

    EXPECT_FALSE(v1->equals(v2));
    EXPECT_FALSE(v2->equals(v1));
}